

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

void setupSourceManager(SourceManager *sourceManager)

{
  StringRef macroName;
  string_view pattern;
  StringRef macroName_00;
  string_view pattern_00;
  StringRef macroName_01;
  string_view pattern_01;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  error_code eVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string testDir;
  AssertionHandler catchAssertionHandler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  long *local_a8;
  size_t local_a0;
  long local_98 [2];
  AssertionHandler local_88;
  ITransientExpression local_40;
  ITransientExpression local_30;
  ITransientExpression local_20;
  
  findTestDir_abi_cxx11_();
  local_c8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_c8._M_string_length = 0x1f;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x2a;
  capturedExpression.m_start = "!sourceManager.addUserDirectories(testDir)";
  Catch::AssertionHandler::AssertionHandler
            (&local_88,macroName,(SourceLineInfo *)&local_c8,capturedExpression,ContinueOnFailure);
  pattern._M_str = (char *)local_a8;
  pattern._M_len = local_a0;
  eVar1 = slang::SourceManager::addUserDirectories(sourceManager,pattern);
  local_40.m_result = eVar1._M_value == 0;
  local_40.m_isBinaryExpression = false;
  local_40._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_006c9198;
  local_40._10_1_ = local_40.m_result;
  Catch::AssertionHandler::handleExpr(&local_88,&local_40);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_c8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_c8._M_string_length = 0x20;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x2c;
  capturedExpression_00.m_start = "!sourceManager.addSystemDirectories(testDir)";
  Catch::AssertionHandler::AssertionHandler
            (&local_88,macroName_00,(SourceLineInfo *)&local_c8,capturedExpression_00,
             ContinueOnFailure);
  pattern_00._M_str = (char *)local_a8;
  pattern_00._M_len = local_a0;
  eVar1 = slang::SourceManager::addSystemDirectories(sourceManager,pattern_00);
  local_30.m_result = eVar1._M_value == 0;
  local_30.m_isBinaryExpression = false;
  local_30._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_006c9198;
  local_30._10_1_ = local_30.m_result;
  Catch::AssertionHandler::handleExpr(&local_88,&local_30);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_c8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_c8._M_string_length = 0x21;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x38;
  capturedExpression_01.m_start = "!sourceManager.addSystemDirectories(testDir + \"system/\")";
  Catch::AssertionHandler::AssertionHandler
            (&local_88,macroName_01,(SourceLineInfo *)&local_c8,capturedExpression_01,
             ContinueOnFailure);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_c8,"system/");
  pattern_01._M_str = local_c8._M_dataplus._M_p;
  pattern_01._M_len = local_c8._M_string_length;
  eVar1 = slang::SourceManager::addSystemDirectories(sourceManager,pattern_01);
  local_20.m_result = eVar1._M_value == 0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_006c9198;
  local_20._10_1_ = local_20.m_result;
  Catch::AssertionHandler::handleExpr(&local_88,&local_20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

void setupSourceManager(SourceManager& sourceManager) {
    auto testDir = findTestDir();
    CHECK(!sourceManager.addUserDirectories(testDir));
    CHECK(!sourceManager.addSystemDirectories(testDir));
    CHECK(!sourceManager.addSystemDirectories(testDir + "system/"));
}